

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O2

Result * __thiscall
CoreML::OneHotEncoder::addInput
          (Result *__return_storage_ptr__,OneHotEncoder *this,string *inputName,
          FeatureType *inputType)

{
  bool bVar1;
  long lVar2;
  initializer_list<CoreML::FeatureType> __l;
  allocator_type local_89;
  __shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2> local_78;
  FeatureType local_68 [2];
  vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> local_48;
  
  FeatureType::Int64();
  FeatureType::String();
  __l._M_len = 2;
  __l._M_array = local_68;
  std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::vector
            (&local_48,__l,&local_89);
  std::__shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             (__shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2> *)
             inputType);
  Model::enforceTypeInvariant(__return_storage_ptr__,&local_48,(FeatureType *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::~vector(&local_48);
  lVar2 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_68[0].m_type.
                       super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -8);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
    std::__shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,
               (__shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2> *)
               inputType);
    Model::addInput(__return_storage_ptr__,&this->super_Model,inputName,(FeatureType *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::addInput(const std::string& inputName, FeatureType inputType) {
        
        HANDLE_RESULT_AND_RETURN_ON_ERROR(enforceTypeInvariant({
            FeatureType::Int64(),
            FeatureType::String(),
        }, inputType));
        
        HANDLE_RESULT_AND_RETURN_ON_ERROR(Model::addInput(inputName, inputType));
        return Result();
    }